

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitV128BitSelect(WasmBytecodeGenerator *this)

{
  RegSlot RVar1;
  WasmRegisterSpace *this_00;
  EmitInfo local_48;
  EmitInfo mask;
  EmitInfo arg2Info;
  EmitInfo arg1Info;
  
  local_48 = PopEvalStack(this,V128,(char16 *)0x0);
  mask = PopEvalStack(this,V128,(char16 *)0x0);
  arg2Info = PopEvalStack(this,V128,(char16 *)0x0);
  ReleaseLocation(this,&local_48);
  ReleaseLocation(this,&mask);
  ReleaseLocation(this,&arg2Info);
  this_00 = GetRegisterSpace(this,V128);
  RVar1 = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x11])
            (this->m_writer,0x126,(ulong)RVar1,(ulong)arg2Info & 0xffffffff,(ulong)mask & 0xffffffff
             ,(ulong)local_48 & 0xffffffff);
  return (EmitInfo)((ulong)RVar1 | 0x500000000);
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitV128BitSelect()
{
    EmitInfo mask = PopEvalStack(WasmTypes::V128);
    EmitInfo arg2Info = PopEvalStack(WasmTypes::V128);
    EmitInfo arg1Info = PopEvalStack(WasmTypes::V128);

    ReleaseLocation(&mask);
    ReleaseLocation(&arg2Info);
    ReleaseLocation(&arg1Info);

    Js::RegSlot resultReg = GetRegisterSpace(WasmTypes::V128)->AcquireTmpRegister();
    EmitInfo resultInfo(resultReg, WasmTypes::V128);
    m_writer->AsmReg4(Js::OpCodeAsmJs::Simd128_BitSelect_I4, resultReg, arg1Info.location, arg2Info.location, mask.location);
    return resultInfo;
}